

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O2

void __thiscall
nn::ESoinn::labelClasses
          (ESoinn *this,
          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *node_axis)

{
  ConcreteLogger *this_00;
  pointer pEVar1;
  pointer pEVar2;
  uint num_neuron;
  string local_58;
  uint32_t local_34 [2];
  uint32_t num_axis;
  
  this_00 = log_netw;
  std::__cxx11::string::string((string *)&local_58,"labelClasses function",(allocator *)local_34);
  num_neuron = 0;
  logger::ConcreteLogger::debug(this_00,&local_58,false);
  std::__cxx11::string::~string((string *)&local_58);
  while( true ) {
    pEVar1 = (this->m_Neurons).
             super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl
             .super__Vector_impl_data._M_start;
    pEVar2 = (this->m_Neurons).
             super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pEVar2 - (long)pEVar1) / 0x88) <= (ulong)num_neuron) break;
    if (pEVar1[num_neuron].m_IsDeleted == false) {
      isNodeAxis(this,num_neuron);
    }
    num_neuron = num_neuron + 1;
  }
  local_58._M_dataplus._M_p._0_4_ = 0;
  while( true ) {
    if ((ulong)(((long)pEVar2 - (long)pEVar1) / 0x88) <= (ulong)(uint)local_58._M_dataplus._M_p)
    break;
    if (pEVar1[(uint)local_58._M_dataplus._M_p].m_IsDeleted == false) {
      local_34[0] = findAxisForNode(this,(uint)local_58._M_dataplus._M_p);
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
      ::_M_emplace_unique<unsigned_int&,unsigned_int&>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                  *)node_axis,(uint *)&local_58,local_34);
      pEVar1 = (this->m_Neurons).
               super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pEVar1[(uint)local_58._M_dataplus._M_p].m_CurClass = local_34[0];
      pEVar2 = (this->m_Neurons).
               super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    local_58._M_dataplus._M_p._0_4_ = (uint)local_58._M_dataplus._M_p + 1;
  }
  return;
}

Assistant:

void ESoinn::labelClasses(std::map<uint32_t, uint32_t>& node_axis)
    {
        log_netw->debug("labelClasses function");
        //find neighbour with max density for each neuron
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            
            isNodeAxis(i);
        }
        
        //find axis for each node
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            
            uint32_t num_axis = findAxisForNode(i);
            node_axis.emplace(i, num_axis);
            m_Neurons[i].setCurClass(num_axis);
        }
    }